

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O2

Class class_setSuperclass(Class cls,Class newSuper)

{
  Class poVar1;
  Class cls_00;
  byte bVar2;
  Class poVar3;
  
  if (newSuper == (Class)0x0 || cls == (Class)0x0) {
    poVar3 = (Class)0x0;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&runtime_mutex);
    poVar1 = cls->super_class;
    if (poVar1 == newSuper) {
      bVar2 = 0;
      poVar3 = newSuper;
    }
    else {
      safe_remove_from_subclass_list(cls);
      objc_resolve_class(newSuper);
      cls->super_class = newSuper;
      cls->sibling_class = newSuper->subclass_list;
      newSuper->subclass_list = cls;
      if ((cls->info & 1) == 0) {
        poVar3 = cls->isa;
        cls_00 = newSuper->isa;
        safe_remove_from_subclass_list(poVar3);
        objc_resolve_class(cls_00);
        poVar3->super_class = cls_00;
        poVar3->isa = cls_00->isa;
        poVar3->sibling_class = cls_00->subclass_list;
        cls_00->subclass_list = poVar3;
      }
      else {
        cls->isa = newSuper->isa;
      }
      pthread_mutex_lock((pthread_mutex_t *)&initialize_lock);
      bVar2 = (byte)((uint)(int)cls->info >> 8) & 1;
      pthread_mutex_unlock((pthread_mutex_t *)&initialize_lock);
      poVar3 = poVar1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&runtime_mutex);
    if (bVar2 != 0) {
      objc_send_initialize((id)newSuper);
      objc_update_dtable_for_new_superclass(cls->isa,newSuper->isa);
      objc_update_dtable_for_new_superclass(cls,newSuper);
      poVar3 = poVar1;
    }
  }
  return poVar3;
}

Assistant:

__attribute__((deprecated))
Class class_setSuperclass(Class cls, Class newSuper)
{
	CHECK_ARG(cls);
	CHECK_ARG(newSuper);
	Class oldSuper;
	if (Nil == cls) { return Nil; }

	{
		LOCK_RUNTIME_FOR_SCOPE();

		oldSuper = cls->super_class;

		if (oldSuper == newSuper) { return newSuper; }

		safe_remove_from_subclass_list(cls);
		objc_resolve_class(newSuper);

		cls->super_class = newSuper;

		// The super class's subclass list is used in certain method resolution scenarios.
		cls->sibling_class = cls->super_class->subclass_list;
		cls->super_class->subclass_list = cls;

		if (UNLIKELY(class_isMetaClass(cls)))
		{
			// newSuper is presumably a metaclass. Its isa will therefore be the appropriate root metaclass.
			cls->isa = newSuper->isa;
		}
		else
		{
			Class meta = cls->isa, newSuperMeta = newSuper->isa;
			// Update the metaclass's superclass.
			safe_remove_from_subclass_list(meta);
			objc_resolve_class(newSuperMeta);

			meta->super_class = newSuperMeta;
			meta->isa = newSuperMeta->isa;

			// The super class's subclass list is used in certain method resolution scenarios.
			meta->sibling_class = newSuperMeta->subclass_list;
			newSuperMeta->subclass_list = meta;
		}

		LOCK_FOR_SCOPE(&initialize_lock);
		if (!objc_test_class_flag(cls, objc_class_flag_initialized))
		{
			// Uninitialized classes don't have dtables to update
			// and don't need their superclasses initialized.
			return oldSuper;
		}
	}

	objc_send_initialize((id)newSuper); // also initializes the metaclass
	objc_update_dtable_for_new_superclass(cls->isa, newSuper->isa);
	objc_update_dtable_for_new_superclass(cls, newSuper);

	return oldSuper;
}